

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeMemAllocDeviceEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t param_1,ze_device_mem_alloc_desc_t *param_2
          ,size_t param_3,size_t param_4,ze_device_handle_t param_5,void **param_6,
          ze_result_t result)

{
  allocator local_39;
  string local_38;
  
  if (result == ZE_RESULT_SUCCESS) {
    std::__cxx11::string::string((string *)&local_38,"zeMemAllocDevice",&local_39);
    countFunctionCall(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return result;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeMemAllocDeviceEpilogue(ze_context_handle_t, const ze_device_mem_alloc_desc_t *, size_t, size_t, ze_device_handle_t, void **, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeMemAllocDevice");
        }
        return result;
    }